

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_def.c
# Opt level: O3

_Bool upb_MessageDef_MiniDescriptorEncode(upb_MessageDef *m,upb_Arena *a,upb_StringView *out)

{
  uint uVar1;
  char *pcVar2;
  _Bool _Var3;
  int iVar4;
  upb_FieldType uVar5;
  upb_FieldType value_type;
  uint32_t uVar6;
  int iVar7;
  upb_FieldDef *puVar8;
  upb_FieldDef *f;
  uint64_t uVar9;
  uint64_t uVar10;
  upb_FieldDef **ppuVar11;
  upb_OneofDef *o;
  byte bVar12;
  int i;
  long lVar13;
  upb_DescState s;
  upb_DescState local_70;
  
  local_70.bufsize = 0x20;
  local_70.buf = (char *)0x0;
  local_70.ptr = (char *)0x0;
  _Var3 = _upb_DescState_Grow(&local_70,a);
  if (_Var3) {
    if ((m->opts[1].base_dont_copy_me__upb_internal_use_only.field_0.internal_opaque & 0x100000000)
        == 0) {
      if ((m->opts[1].base_dont_copy_me__upb_internal_use_only.field_0.internal_opaque & 0x100) == 0
         ) {
        if (m->is_sorted == false) {
          ppuVar11 = _upb_FieldDefs_Sorted(m->fields,m->field_count,a);
          if (ppuVar11 == (upb_FieldDef **)0x0) {
            return false;
          }
        }
        else {
          ppuVar11 = (upb_FieldDef **)0x0;
        }
        pcVar2 = local_70.ptr;
        uVar1 = (uint)(*(int *)((long)&m->resolved_features[2].
                                       base_dont_copy_me__upb_internal_use_only.field_0 + 4) == 1) *
                2;
        uVar9 = (uint64_t)uVar1;
        if (0 < m->field_count) {
          iVar4 = 0;
          bVar12 = 0;
          do {
            puVar8 = upb_MessageDef_Field(m,iVar4);
            _Var3 = _upb_FieldDef_ValidateUtf8(puVar8);
            if (!_Var3) goto LAB_00123699;
            uVar5 = upb_FieldDef_Type(puVar8);
            bVar12 = bVar12 | uVar5 == kUpb_FieldType_String;
            iVar4 = iVar4 + 1;
          } while (iVar4 < m->field_count);
          uVar9 = (uint64_t)(uVar1 | bVar12);
        }
LAB_00123699:
        uVar10 = uVar9 + 4;
        if (m->ext_range_count == 0) {
          uVar10 = uVar9;
        }
        local_70.ptr = upb_MtDataEncoder_StartMessage(&local_70.e,pcVar2,uVar10);
        if (0 < m->field_count) {
          lVar13 = 0;
          do {
            if (ppuVar11 == (upb_FieldDef **)0x0) {
              puVar8 = upb_MessageDef_Field(m,(int)lVar13);
            }
            else {
              puVar8 = ppuVar11[lVar13];
            }
            uVar5 = upb_FieldDef_Type(puVar8);
            uVar6 = upb_FieldDef_Number(puVar8);
            uVar9 = _upb_FieldDef_Modifiers(puVar8);
            _Var3 = _upb_DescState_Grow(&local_70,a);
            if (!_Var3) {
              return false;
            }
            local_70.ptr = upb_MtDataEncoder_PutField(&local_70.e,local_70.ptr,uVar5,uVar6,uVar9);
            lVar13 = lVar13 + 1;
          } while (lVar13 < m->field_count);
        }
        if (0 < m->real_oneof_count) {
          iVar4 = 0;
          do {
            _Var3 = _upb_DescState_Grow(&local_70,a);
            if (!_Var3) {
              return false;
            }
            local_70.ptr = upb_MtDataEncoder_StartOneof(&local_70.e,local_70.ptr);
            o = upb_MessageDef_Oneof(m,iVar4);
            iVar7 = upb_OneofDef_FieldCount(o);
            if (0 < iVar7) {
              i = 0;
              do {
                puVar8 = upb_OneofDef_Field(o,i);
                uVar6 = upb_FieldDef_Number(puVar8);
                _Var3 = _upb_DescState_Grow(&local_70,a);
                if (!_Var3) {
                  return false;
                }
                local_70.ptr = upb_MtDataEncoder_PutOneofField(&local_70.e,local_70.ptr,uVar6);
                i = i + 1;
              } while (iVar7 != i);
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 < m->real_oneof_count);
        }
      }
      else {
        local_70.ptr = upb_MtDataEncoder_EncodeMessageSet(&local_70.e,local_70.ptr);
      }
    }
    else {
      if (m->field_count != 2) {
        return false;
      }
      puVar8 = upb_MessageDef_Field(m,0);
      f = upb_MessageDef_Field(m,1);
      if (f == (upb_FieldDef *)0x0 || puVar8 == (upb_FieldDef *)0x0) {
        return false;
      }
      iVar4 = _upb_FieldDef_LayoutIndex(puVar8);
      if (iVar4 != 0) {
        __assert_fail("_upb_FieldDef_LayoutIndex(key_field) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/reflection/message_def.c"
                      ,0x236,
                      "_Bool _upb_MessageDef_EncodeMap(upb_DescState *, const upb_MessageDef *, upb_Arena *)"
                     );
      }
      iVar4 = _upb_FieldDef_LayoutIndex(f);
      pcVar2 = local_70.ptr;
      if (iVar4 != 1) {
        __assert_fail("_upb_FieldDef_LayoutIndex(val_field) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/reflection/message_def.c"
                      ,0x237,
                      "_Bool _upb_MessageDef_EncodeMap(upb_DescState *, const upb_MessageDef *, upb_Arena *)"
                     );
      }
      uVar5 = upb_FieldDef_Type(puVar8);
      value_type = upb_FieldDef_Type(f);
      uVar9 = _upb_FieldDef_Modifiers(puVar8);
      uVar10 = _upb_FieldDef_Modifiers(f);
      local_70.ptr = upb_MtDataEncoder_EncodeMap(&local_70.e,pcVar2,uVar5,value_type,uVar9,uVar10);
    }
    _Var3 = _upb_DescState_Grow(&local_70,a);
    if (_Var3) {
      *local_70.ptr = '\0';
      out->data = local_70.buf;
      out->size = (long)local_70.ptr - (long)local_70.buf;
      return true;
    }
  }
  return false;
}

Assistant:

bool upb_MessageDef_MiniDescriptorEncode(const upb_MessageDef* m, upb_Arena* a,
                                         upb_StringView* out) {
  upb_DescState s;
  _upb_DescState_Init(&s);

  if (!_upb_DescState_Grow(&s, a)) return false;

  if (upb_MessageDef_IsMapEntry(m)) {
    if (!_upb_MessageDef_EncodeMap(&s, m, a)) return false;
  } else if (UPB_DESC(MessageOptions_message_set_wire_format)(m->opts)) {
    if (!_upb_MessageDef_EncodeMessageSet(&s, m, a)) return false;
  } else {
    if (!_upb_MessageDef_EncodeMessage(&s, m, a)) return false;
  }

  if (!_upb_DescState_Grow(&s, a)) return false;
  *s.ptr = '\0';

  out->data = s.buf;
  out->size = s.ptr - s.buf;
  return true;
}